

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.c
# Opt level: O1

uint64_t nn_clock_ms(void)

{
  int iVar1;
  uint64_t extraout_RAX;
  uint64_t uVar2;
  uint64_t extraout_RAX_00;
  int __fd;
  timespec tv;
  timespec local_10;
  undefined4 extraout_var;
  
  __fd = 1;
  iVar1 = clock_gettime(1,&local_10);
  if (iVar1 != 0) {
    nn_clock_ms_cold_1();
    uVar2 = extraout_RAX;
    if (-1 < __fd) {
      iVar1 = close(__fd);
      uVar2 = CONCAT44(extraout_var,iVar1);
      if (iVar1 != 0) {
        nn_closefd_cold_1();
        uVar2 = extraout_RAX_00;
      }
    }
    return uVar2;
  }
  return local_10.tv_nsec / 1000000 + local_10.tv_sec * 1000;
}

Assistant:

uint64_t nn_clock_ms (void)
{
#if defined NN_HAVE_WINDOWS

    LARGE_INTEGER tps;
    LARGE_INTEGER time;
    double tpms;

    QueryPerformanceFrequency (&tps);
    QueryPerformanceCounter (&time);
    tpms = (double) (tps.QuadPart / 1000);
    return (uint64_t) (time.QuadPart / tpms);

#elif defined NN_HAVE_OSX

    static mach_timebase_info_data_t nn_clock_timebase_info;
    uint64_t ticks;

    /*  If the global timebase info is not initialised yet, init it. */
    if (nn_slow (!nn_clock_timebase_info.denom))
        mach_timebase_info (&nn_clock_timebase_info);

    ticks = mach_absolute_time ();
    return ticks * nn_clock_timebase_info.numer /
        nn_clock_timebase_info.denom / 1000000;

#elif defined NN_HAVE_GETHRTIME

    return gethrtime () / 1000000;

#elif defined NN_HAVE_CLOCK_MONOTONIC

    int rc;
    struct timespec tv;

    rc = clock_gettime (CLOCK_MONOTONIC, &tv);
    errno_assert (rc == 0);
    return tv.tv_sec * (uint64_t) 1000 + tv.tv_nsec / 1000000;

#else

    int rc;
    struct timeval tv;

    /*  Gettimeofday is slow on some systems. Moreover, it's not necessarily
        monotonic. Thus, it's used as a last resort mechanism. */
    rc = gettimeofday (&tv, NULL);
    errno_assert (rc == 0);
    return tv.tv_sec * (uint64_t) 1000 + tv.tv_usec / 1000;

#endif
}